

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

StyleProp * CreateProps(TidyDocImpl *doc,StyleProp *prop,ctmbstr style)

{
  StyleProp *pSVar1;
  int iVar2;
  tmbstr ptVar3;
  char *pcVar4;
  StyleProp *pSVar5;
  tmbstr ptVar6;
  char cVar7;
  ctmbstr str;
  char *pcVar8;
  char *str_00;
  ctmbstr ptVar9;
  StyleProp *local_50;
  StyleProp *local_40;
  
  ptVar3 = prvTidytmbstrdup(doc->allocator,style);
  pcVar8 = ptVar3;
  while (cVar7 = *pcVar8, local_50 = prop, cVar7 != '\0') {
    pcVar4 = pcVar8 + 2;
    str_00 = pcVar8;
    while (ptVar9 = str_00, cVar7 == ' ') {
      pcVar8 = str_00 + 1;
      str_00 = str_00 + 1;
      pcVar4 = pcVar4 + 1;
      cVar7 = *pcVar8;
    }
    while( true ) {
      if (cVar7 == '\0') goto LAB_00148bfe;
      str = ptVar9;
      if (cVar7 == ':') break;
      cVar7 = ptVar9[1];
      pcVar4 = pcVar4 + 1;
      ptVar9 = ptVar9 + 1;
    }
    do {
      pcVar8 = pcVar4;
      cVar7 = str[1];
      str = str + 1;
      pcVar4 = pcVar8 + 1;
    } while (cVar7 == ' ');
    while ((cVar7 != '\0' && (cVar7 != ';'))) {
      cVar7 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    }
    *ptVar9 = '\0';
    pcVar8[-1] = '\0';
    local_40 = (StyleProp *)0x0;
    pSVar1 = prop;
    while (pSVar5 = pSVar1, pSVar5 != (StyleProp *)0x0) {
      iVar2 = prvTidytmbstrcmp(pSVar5->name,str_00);
      if (iVar2 == 0) goto LAB_00148bd8;
      if (0 < iVar2) {
        local_50 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
        ptVar6 = prvTidytmbstrdup(doc->allocator,str_00);
        local_50->name = ptVar6;
        ptVar6 = prvTidytmbstrdup(doc->allocator,str);
        local_50->value = ptVar6;
        local_50->next = pSVar5;
        goto LAB_00148bc5;
      }
      local_40 = pSVar5;
      pSVar1 = pSVar5->next;
    }
    local_50 = (StyleProp *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x18);
    ptVar6 = prvTidytmbstrdup(doc->allocator,str_00);
    local_50->name = ptVar6;
    ptVar6 = prvTidytmbstrdup(doc->allocator,str);
    local_50->value = ptVar6;
    local_50->next = (StyleProp *)0x0;
LAB_00148bc5:
    if (local_40 != (StyleProp *)0x0) {
      local_40->next = local_50;
      local_50 = prop;
    }
LAB_00148bd8:
    *ptVar9 = ':';
    if (cVar7 == '\0') break;
    pcVar8[-1] = ';';
    prop = local_50;
  }
LAB_00148bfe:
  (*doc->allocator->vtbl->free)(doc->allocator,ptVar3);
  return local_50;
}

Assistant:

static StyleProp* CreateProps( TidyDocImpl* doc, StyleProp* prop, ctmbstr style )
{
    tmbstr name, value = NULL, name_end, value_end, line;
    Bool more;

    line = TY_(tmbstrdup)(doc->allocator, style);
    name = line;

    while (*name)
    {
        while (*name == ' ')
            ++name;

        name_end = name;

        while (*name_end)
        {
            if (*name_end == ':')
            {
                value = name_end + 1;
                break;
            }

            ++name_end;
        }

        if (*name_end != ':')
            break;

        while ( value && *value == ' ')
            ++value;

        value_end = value;
        more = no;

        while (*value_end)
        {
            if (*value_end == ';')
            {
                more = yes;
                break;
            }

            ++value_end;
        }

        *name_end = '\0';
        *value_end = '\0';

        prop = InsertProperty(doc, prop, name, value);
        *name_end = ':';

        if (more)
        {
            *value_end = ';';
            name = value_end + 1;
            continue;
        }

        break;
    }

    TidyDocFree(doc, line);  /* free temporary copy */
    return prop;
}